

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

int Au_NtkAllocObj(Au_Ntk_t *p,int nFanins,int Type)

{
  undefined8 *puVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  Vec_Int_t *p_00;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  ulong *puVar12;
  
  do {
    uVar9 = (((int)(nFanins + 2U) >> 2) + 1) - (uint)((nFanins + 2U & 3) == 0);
    uVar6 = uVar9;
    if (0x3f < (int)uVar9) {
      uVar6 = ((uint)((uVar9 - 0x3f & 0x3f) != 0) * 0x40 + uVar9) - 0x3f | 0x3f;
    }
    uVar8 = (p->vPages).nSize;
    if (((ulong)uVar8 == 0) || (uVar5 = p->iHandle, 0x1000 < (int)(uVar5 + uVar6))) {
      if ((int)uVar6 < 0xfc1) {
        pvVar3 = calloc(0x1040,0x10);
        uVar8 = 0x1040;
      }
      else {
        uVar8 = uVar6 + 0x40;
        pvVar3 = calloc((ulong)uVar8,0x10);
      }
      p->nObjsAlloc = p->nObjsAlloc + uVar8;
      pVVar2 = p->vChunks;
      uVar8 = pVVar2->nCap;
      if (pVVar2->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar4;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar8 * 2;
          if (iVar10 <= (int)uVar8) goto LAB_008510d0;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar8 << 4);
          }
          pVVar2->pArray = ppvVar4;
        }
        pVVar2->nCap = iVar10;
      }
LAB_008510d0:
      iVar10 = pVVar2->nSize;
      pVVar2->nSize = iVar10 + 1;
      pVVar2->pArray[iVar10] = pvVar3;
      pvVar11 = (void *)(((ulong)pvVar3 & 0xfffffffffffffff0) + 0x10);
      if (((ulong)pvVar3 & 0xf) == 0) {
        pvVar11 = pvVar3;
      }
      if (((ulong)pvVar11 & 0xf) != 0) {
        __assert_fail("((ABC_PTRINT_T)pMem & 0xF) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x309,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
      }
      uVar5 = (uint)((ulong)pvVar11 >> 4) & 0x3f;
      uVar8 = 0x40 - uVar5;
      if (((ulong)pvVar11 >> 4 & 0x3f) == 0) {
        uVar8 = uVar5;
      }
      pvVar11 = (void *)((ulong)(uVar8 << 4) + (long)pvVar11);
      p->iHandle = 0;
      uVar8 = (p->vPages).nCap;
      if ((p->vPages).nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          ppvVar4 = (p->vPages).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          (p->vPages).pArray = ppvVar4;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar8 * 2;
          if (iVar10 <= (int)uVar8) goto LAB_00851196;
          ppvVar4 = (p->vPages).pArray;
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar8 << 4);
          }
          (p->vPages).pArray = ppvVar4;
        }
        (p->vPages).nCap = iVar10;
      }
LAB_00851196:
      iVar10 = (p->vPages).nSize;
      uVar8 = iVar10 + 1;
      (p->vPages).nSize = uVar8;
      (p->vPages).pArray[iVar10] = pvVar11;
      if ((long)iVar10 < 0) {
LAB_00851303:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      pvVar3 = (p->vPages).pArray[(ulong)uVar8 - 1];
      uVar5 = p->iHandle;
      lVar7 = (long)(int)uVar5 * 0x10;
      puVar1 = (undefined8 *)((long)pvVar3 + lVar7);
      if (((ulong)puVar1 & 0x3f0) != 0) {
LAB_00851322:
        __assert_fail("(((ABC_PTRINT_T)(pMem + p->iHandle) & 0x3FF) >> 4) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                      ,0x2f4,"void Au_NtkInsertHeader(Au_Ntk_t *)");
      }
      *puVar1 = p;
      *(uint *)((long)pvVar3 + lVar7 + 8) = uVar8 * 0x1000 + (uVar5 & 0xfc0) + -0x1000;
      p->iHandle = p->iHandle + 1;
      break;
    }
    if ((int)uVar8 < 1) goto LAB_00851303;
    pvVar11 = (p->vPages).pArray[(ulong)uVar8 - 1];
    uVar8 = uVar5 & 0x3f;
    if ((uVar8 == 0) || ((int)(0x40 - uVar8) < (int)uVar6)) {
      if (uVar8 != 0) {
        p->iHandle = (uVar5 & 0xffffffc0) + 0x40;
      }
      iVar10 = (p->vPages).nSize;
      if ((long)iVar10 < 1) goto LAB_00851303;
      pvVar3 = (p->vPages).pArray[(long)iVar10 + -1];
      uVar8 = p->iHandle;
      lVar7 = (long)(int)uVar8 * 0x10;
      puVar1 = (undefined8 *)((long)pvVar3 + lVar7);
      if (((ulong)puVar1 & 0x3f0) != 0) goto LAB_00851322;
      *puVar1 = p;
      *(uint *)((long)pvVar3 + lVar7 + 8) = (uVar8 & 0xfc0) + iVar10 * 0x1000 + -0x1000;
      p->iHandle = p->iHandle + 1;
    }
  } while (0x1000 < (int)(p->iHandle + uVar6));
  lVar7 = (long)p->iHandle * 0x10;
  if (*(int *)((long)pvVar11 + lVar7) != 0) {
    __assert_fail("*((int *)pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,800,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  puVar12 = (ulong *)((long)pvVar11 + lVar7);
  *puVar12 = (ulong)(Type & 7) << 0x20 | (ulong)(uint)nFanins << 0x23 | (ulong)(uint)*puVar12;
  p->nObjs[Type & 7] = p->nObjs[Type & 7] + 1;
  if (Type == 3) {
    uVar8 = (p->vPos).nSize;
    if (((int)uVar8 < 0) || (*(uint *)((long)puVar12 + 0xc) != 0)) {
LAB_00851341:
      __assert_fail("f >= 0 && p->Fanins[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                    ,0xb3,"void Au_ObjSetFaninLit(Au_Obj_t *, int, int)");
    }
    p_00 = &p->vPos;
    *(uint *)((long)puVar12 + 0xc) = uVar8;
  }
  else {
    if (Type != 2) goto LAB_0085129e;
    uVar8 = (p->vPis).nSize;
    if (((int)uVar8 < 0) || ((uint)puVar12[1] != 0)) goto LAB_00851341;
    p_00 = &p->vPis;
    *(uint *)(puVar12 + 1) = uVar8;
  }
  Vec_IntPush(p_00,(uint)((ulong)puVar12 >> 4) & 0x3f |
                   *(uint *)(((ulong)puVar12 & 0xfffffffffffffc00) + 8));
LAB_0085129e:
  p->iHandle = p->iHandle + uVar6;
  p->nObjsUsed = p->nObjsUsed + uVar9;
  uVar6 = *(uint *)(((ulong)puVar12 & 0xfffffffffffffc00) + 8);
  uVar9 = (uint)((ulong)puVar12 >> 4) & 0x3f;
  uVar8 = uVar9 | uVar6;
  Vec_IntPush(&p->vObjs,uVar8);
  if ((ulong *)((ulong)((uVar9 | uVar6 & 0xfff) << 4) + (long)(p->vPages).pArray[(int)uVar6 >> 0xc])
      != puVar12) {
    __assert_fail("pTemp == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                  ,0x333,"int Au_NtkAllocObj(Au_Ntk_t *, int, int)");
  }
  return uVar8;
}

Assistant:

int Au_NtkAllocObj( Au_Ntk_t * p, int nFanins, int Type )
{
    Au_Obj_t * pMem, * pObj, * pTemp;
    int nObjInt = ((2+nFanins) >> 2) + (((2+nFanins) & 3) > 0);
    int Id, nObjIntReal = nObjInt;
    if ( nObjInt > 63 )
        nObjInt = 63 + 64 * (((nObjInt-63) >> 6) + (((nObjInt-63) & 63) > 0));
    if ( Vec_PtrSize(&p->vPages) == 0 || p->iHandle + nObjInt > (1 << 12) )
    {
        if ( nObjInt + 64 > (1 << 12) )
            pMem = ABC_CALLOC( Au_Obj_t, nObjInt + 64 ), p->nObjsAlloc += nObjInt + 64;
        else
            pMem = ABC_CALLOC( Au_Obj_t, (1 << 12) + 64 ), p->nObjsAlloc += (1 << 12) + 64;
        Vec_PtrPush( p->vChunks, pMem );
        if ( ((ABC_PTRINT_T)pMem & 0xF) )
            pMem = (Au_Obj_t *)((char *)pMem + 16 - ((ABC_PTRINT_T)pMem & 0xF));
        assert( ((ABC_PTRINT_T)pMem & 0xF) == 0 );
        p->iHandle = (((ABC_PTRINT_T)pMem & 0x3FF) >> 4);
        if ( p->iHandle )
        {
            pMem += 64 - (p->iHandle & 63);
            p->iHandle = 0; 
        }
        Vec_PtrPush( &p->vPages, pMem );
        Au_NtkInsertHeader( p );
    }
    else
    {
        pMem = (Au_Obj_t *)Vec_PtrEntryLast( &p->vPages );
        if ( (p->iHandle & 63) == 0 || nObjInt > (64 - (p->iHandle & 63)) )
        {
            if ( p->iHandle & 63 )
                p->iHandle += 64 - (p->iHandle & 63); 
            Au_NtkInsertHeader( p );
        }
        if ( p->iHandle + nObjInt > (1 << 12) )
            return Au_NtkAllocObj( p, nFanins, Type );
    }
    pObj = pMem + p->iHandle;
    assert( *((int *)pObj) == 0 );
    pObj->nFanins = nFanins;
    p->nObjs[pObj->Type = Type]++;
    if ( Type == AU_OBJ_PI )
    {
        Au_ObjSetFaninLit( pObj, 0, Vec_IntSize(&p->vPis) );
        Vec_IntPush( &p->vPis, Au_ObjId(pObj) );
    }
    else if ( Type == AU_OBJ_PO )
    {
        Au_ObjSetFaninLit( pObj, 1, Vec_IntSize(&p->vPos) );
        Vec_IntPush( &p->vPos, Au_ObjId(pObj) );
    }
    p->iHandle += nObjInt;
    p->nObjsUsed += nObjIntReal;

    Id = Au_ObjId(pObj);
    Vec_IntPush( &p->vObjs, Id );
    pTemp = Au_NtkObj( p, Id );
    assert( pTemp == pObj );
    return Id;
}